

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getFe(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_98;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_98);
  return (RealType)local_98;
}

Assistant:

RealType EAMAdapter::getFe() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.Fe;
  }